

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixtree.hpp
# Opt level: O3

void __thiscall RadixTree::insert(RadixTree *this,uint64_t vadd,uint64_t padd)

{
  value_type *__val;
  undefined8 *puVar1;
  void *pvVar2;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
  *pvVar3;
  long *plVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = (uint)vadd & 0x1ff;
  uVar7 = (ulong)uVar6;
  pvVar3 = (this->t_).
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7];
  if (pvVar3 == (vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
                 *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    pvVar2 = operator_new(0x1000);
    *puVar1 = pvVar2;
    puVar1[2] = (long)pvVar2 + 0x1000;
    memset(pvVar2,0,0x1000);
    puVar1[1] = (long)pvVar2 + 0x1000;
    *(undefined8 **)
     ((long)(this->t_).
            super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar6 * 8)) = puVar1;
    pvVar3 = *(vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
               **)((long)(this->t_).
                         super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar6 * 8));
  }
  plVar4 = *(long **)(*(long *)&(pvVar3->
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
                                )._M_impl + uVar7 * 8);
  if (plVar4 == (long *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    pvVar2 = operator_new(0x1000);
    *puVar1 = pvVar2;
    puVar1[2] = (long)pvVar2 + 0x1000;
    memset(pvVar2,0,0x1000);
    puVar1[1] = (long)pvVar2 + 0x1000;
    uVar5 = (ulong)(uVar6 * 8);
    *(undefined8 **)
     (**(long **)((long)(this->t_).
                        super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar5) + uVar5) = puVar1;
    plVar4 = *(long **)(**(long **)((long)(this->t_).
                                          super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar5) + uVar5
                       );
  }
  plVar4 = *(long **)(*plVar4 + uVar7 * 8);
  if (plVar4 == (long *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    pvVar2 = operator_new(0x1000);
    *puVar1 = pvVar2;
    puVar1[2] = (long)pvVar2 + 0x1000;
    memset(pvVar2,0,0x1000);
    puVar1[1] = (long)pvVar2 + 0x1000;
    uVar5 = (ulong)(uVar6 * 8);
    *(undefined8 **)
     (**(long **)(**(long **)((long)(this->t_).
                                    super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar5) + uVar5) +
     uVar5) = puVar1;
    plVar4 = *(long **)(**(long **)(**(long **)((long)(this->t_).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar5)
                                   + uVar5) + uVar5);
  }
  *(uint64_t *)(*plVar4 + uVar7 * 8) = padd & 0xffffffffff000;
  this->s_ = this->s_ + 1;
  return;
}

Assistant:

void insert(uint64_t vadd, uint64_t padd) {
    uint16_t p4k = p4_key(vadd);
    uint16_t p3k = p3_key(vadd);
    uint16_t p2k = p2_key(vadd);
    uint16_t p1k = p1_key(vadd);
    if(t_[p4k] == NULL)
      t_[p4k] = new vector< vector< vector<uint64_t>* >* >(p3_size);
    if((*t_[p4k])[p3k] == NULL)
      (*t_[p4k])[p3k] = new vector< vector<uint64_t>* >(p2_size);
    if((*(*t_[p4k])[p3k])[p2k] == NULL)
      (*(*t_[p4k])[p3k])[p2k] = new vector<uint64_t>(p1_size);
    (*(*(*t_[p4k])[p3k])[p2k])[p1k] = pb_add(padd) << 12;
    ++s_;
  }